

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_dupset(SessionHandle *dst,SessionHandle *src)

{
  CURLcode CVar1;
  long lVar2;
  char **__s;
  
  memcpy(&dst->set,&src->set,0x500);
  __s = (dst->set).str;
  memset(__s,0,0x140);
  lVar2 = 0;
  do {
    if (lVar2 == 0x140) {
      return CURLE_OK;
    }
    CVar1 = setstropt((char **)((long)__s + lVar2),*(char **)((long)(src->set).str + lVar2));
    lVar2 = lVar2 + 8;
  } while (CVar1 == CURLE_OK);
  return CVar1;
}

Assistant:

CURLcode Curl_dupset(struct SessionHandle *dst, struct SessionHandle *src)
{
  CURLcode r = CURLE_OK;
  enum dupstring i;

  /* Copy src->set into dst->set first, then deal with the strings
     afterwards */
  dst->set = src->set;

  /* clear all string pointers first */
  memset(dst->set.str, 0, STRING_LAST * sizeof(char *));

  /* duplicate all strings */
  for(i=(enum dupstring)0; i< STRING_LAST; i++) {
    r = setstropt(&dst->set.str[i], src->set.str[i]);
    if(r != CURLE_OK)
      break;
  }

  /* If a failure occurred, freeing has to be performed externally. */
  return r;
}